

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_basic_constraints(uchar **p,uchar *end,int *ca_istrue,int *max_pathlen)

{
  int iVar1;
  int iVar2;
  size_t len;
  size_t local_30;
  
  iVar2 = 0;
  *ca_istrue = 0;
  *max_pathlen = 0;
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_30,0x30);
  if (iVar1 == 0) {
    if (*p == end) {
      return 0;
    }
    iVar1 = mbedtls_asn1_get_bool(p,end,ca_istrue);
    if (iVar1 != 0) {
      if (iVar1 == -0x62) {
        iVar1 = mbedtls_asn1_get_int(p,end,ca_istrue);
      }
      if (iVar1 != 0) goto LAB_00111806;
      if (*ca_istrue != 0) {
        *ca_istrue = 1;
      }
    }
    if (*p != end) {
      iVar2 = mbedtls_asn1_get_int(p,end,max_pathlen);
      if (iVar2 == 0) {
        iVar2 = -0x2566;
        if (*p == end) {
          *max_pathlen = *max_pathlen + 1;
          iVar2 = 0;
        }
      }
      else {
        iVar2 = iVar2 + -0x2500;
      }
    }
  }
  else {
LAB_00111806:
    iVar2 = iVar1 + -0x2500;
  }
  return iVar2;
}

Assistant:

static int x509_get_basic_constraints( unsigned char **p,
                                       const unsigned char *end,
                                       int *ca_istrue,
                                       int *max_pathlen )
{
    int ret;
    size_t len;

    /*
     * BasicConstraints ::= SEQUENCE {
     *      cA                      BOOLEAN DEFAULT FALSE,
     *      pathLenConstraint       INTEGER (0..MAX) OPTIONAL }
     */
    *ca_istrue = 0; /* DEFAULT FALSE */
    *max_pathlen = 0; /* endless */

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_bool( p, end, ca_istrue ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            ret = mbedtls_asn1_get_int( p, end, ca_istrue );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        if( *ca_istrue != 0 )
            *ca_istrue = 1;
    }

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_int( p, end, max_pathlen ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    (*max_pathlen)++;

    return( 0 );
}